

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O3

_Bool parse_path_coordinates(char **begin,char *end,float *values,int offset,int count)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong uVar3;
  char *pcVar4;
  byte bVar5;
  byte *pbVar6;
  bool bVar7;
  _Bool _Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  if (count < 1) {
    return true;
  }
  pbVar6 = (byte *)*begin;
  uVar3 = 0;
  _Var8 = false;
  do {
    if (pbVar6 < end) {
      if (*pbVar6 != 0x2d) {
        if (*pbVar6 == 0x2b) {
          pbVar6 = pbVar6 + 1;
        }
        goto LAB_0012bf9d;
      }
      pbVar6 = pbVar6 + 1;
      fVar9 = -1.0;
    }
    else {
LAB_0012bf9d:
      fVar9 = 1.0;
    }
    if (end <= pbVar6) {
      return _Var8;
    }
    bVar5 = *pbVar6;
    fVar12 = 0.0;
    if (bVar5 == 0x2e) {
      fVar11 = 0.0;
      pbVar2 = pbVar6;
    }
    else {
      if (9 < (byte)(bVar5 - 0x30)) {
        return _Var8;
      }
      pcVar4 = end + ~(ulong)pbVar6;
      fVar11 = 0.0;
      do {
        fVar11 = fVar11 * 10.0 + (float)(int)(bVar5 - 0x30);
        pbVar2 = (byte *)end;
        if (pcVar4 == (char *)0x0) break;
        bVar5 = pbVar6[1];
        pbVar2 = pbVar6 + 1;
        pcVar4 = pcVar4 + -1;
        pbVar6 = pbVar2;
      } while ((byte)(bVar5 - 0x30) < 10);
    }
    if ((pbVar2 < end) && (*pbVar2 == 0x2e)) {
      pbVar6 = pbVar2 + 1;
      if (end <= pbVar6) {
        return _Var8;
      }
      bVar5 = *pbVar6;
      if (9 < (byte)(bVar5 - 0x30)) {
        return _Var8;
      }
      pcVar4 = end + (-2 - (long)pbVar2);
      fVar12 = 0.0;
      fVar10 = 1.0;
      do {
        fVar12 = fVar12 * 10.0 + (float)(int)(bVar5 - 0x30);
        fVar10 = fVar10 * 10.0;
        pbVar2 = (byte *)end;
        if (pcVar4 == (char *)0x0) break;
        bVar5 = pbVar6[1];
        pbVar2 = pbVar6 + 1;
        pcVar4 = pcVar4 + -1;
        pbVar6 = pbVar2;
      } while ((byte)(bVar5 - 0x30) < 10);
      fVar12 = fVar12 / fVar10;
    }
    if ((pbVar2 < end) && ((*pbVar2 | 0x20) == 0x65)) {
      pbVar6 = pbVar2 + 1;
      pbVar1 = pbVar6;
      if (pbVar6 < end) {
        bVar5 = *pbVar6;
        pbVar1 = pbVar2 + 2;
        if (bVar5 == 0x2b) goto LAB_0012c0c9;
        pbVar1 = pbVar6;
        if (bVar5 == 0x2d) {
          pbVar1 = pbVar2 + 2;
        }
        fVar10 = *(float *)(&DAT_00145174 + (ulong)(bVar5 == 0x2d) * 4);
      }
      else {
LAB_0012c0c9:
        fVar10 = 1.0;
      }
      if (end <= pbVar1) {
        return _Var8;
      }
      bVar5 = *pbVar1;
      if (9 < (byte)(bVar5 - 0x30)) {
        return _Var8;
      }
      pcVar4 = end + ~(ulong)pbVar1;
      fVar13 = 0.0;
      do {
        fVar13 = fVar13 * 10.0 + (float)(int)(bVar5 - 0x30);
        pbVar6 = (byte *)end;
        if (pcVar4 == (char *)0x0) break;
        bVar5 = pbVar1[1];
        pbVar6 = pbVar1 + 1;
        pcVar4 = pcVar4 + -1;
        pbVar1 = pbVar6;
      } while ((byte)(bVar5 - 0x30) < 10);
      *begin = (char *)pbVar6;
      fVar9 = fVar9 * (fVar11 + fVar12);
      values[(uint)offset + uVar3] = fVar9;
      if ((fVar13 != 0.0) || (NAN(fVar13))) {
        fVar9 = powf(10.0,fVar10 * fVar13);
        fVar9 = fVar9 * values[(uint)offset + uVar3];
        goto LAB_0012c1a7;
      }
    }
    else {
      *begin = (char *)pbVar2;
      fVar9 = fVar9 * (fVar11 + fVar12);
LAB_0012c1a7:
      values[(uint)offset + uVar3] = fVar9;
    }
    if (3.4028235e+38 < ABS(fVar9)) {
      return _Var8;
    }
    pbVar6 = (byte *)*begin;
    if (pbVar6 < end) {
      bVar7 = true;
      pbVar2 = pbVar6;
      do {
        pbVar1 = pbVar2;
        if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
        pbVar2 = pbVar2 + 1;
        bVar7 = pbVar2 < end;
        pbVar1 = (byte *)end;
      } while (pbVar2 != (byte *)end);
      if (((!(bool)(~bVar7 & 1U | end <= pbVar1)) && (*pbVar1 == 0x2c)) &&
         (pbVar2 = pbVar1 + 1, pbVar1 = pbVar2, pbVar2 < end)) {
        do {
          pbVar1 = pbVar2;
          if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0))
          break;
          pbVar2 = pbVar2 + 1;
          pbVar1 = (byte *)end;
        } while (pbVar2 != (byte *)end);
      }
      if (pbVar1 != pbVar6) {
        *begin = (char *)pbVar1;
        pbVar6 = pbVar1;
      }
    }
    uVar3 = uVar3 + 1;
    _Var8 = (uint)count <= uVar3;
    if (uVar3 == (uint)count) {
      return _Var8;
    }
  } while( true );
}

Assistant:

static inline bool parse_path_coordinates(const char** begin, const char* end, float values[6], int offset, int count)
{
    for(int i = 0; i < count; i++) {
        if(!plutovg_parse_number(begin, end, values + offset + i))
            return false;
        plutovg_skip_ws_or_comma(begin, end, NULL);
    }

    return true;
}